

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int mapViableBiome(Layer *l,int *out,int x,int z,int w,int h)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = mapBiome(l,out,x,z,w,h);
  if (uVar1 == 0) {
    uVar1 = 1;
    uVar3 = uVar1;
    if (1 < w) {
      uVar3 = w;
    }
    if (0 < h) {
      uVar1 = *l->data;
      uVar5 = 0;
      do {
        if (0 < w) {
          if ((0x10 < uVar1) || ((0x143deU >> (uVar1 & 0x1f) & 1) == 0)) {
            return 0;
          }
          uVar4 = 0;
          do {
            iVar2 = out[uVar4];
            switch(uVar1) {
            case 1:
            case 0x10:
              if (iVar2 == 2) {
                return 0;
              }
              iVar2 = isMesa(iVar2);
              goto LAB_001059a0;
            case 2:
              if (iVar2 == 0x15) {
                return 0;
              }
              break;
            case 3:
              if (iVar2 == 6) {
                return 0;
              }
              break;
            case 4:
              if (iVar2 == 0xc) {
                return 0;
              }
              if (iVar2 == 0x1e) {
                return 0;
              }
              break;
            default:
              if (iVar2 == 0x1d) {
                return 0;
              }
              break;
            case 6:
            case 7:
            case 8:
            case 0xe:
              iVar2 = isOceanic(iVar2);
LAB_001059a0:
              if (iVar2 != 0) {
                return 0;
              }
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        uVar5 = uVar5 + 1;
        out = out + (uint)w;
      } while (uVar5 != (uint)h);
      uVar1 = 1;
    }
  }
  return uVar1;
}

Assistant:

static int mapViableBiome(const Layer * l, int * out, int x, int z, int w, int h)
{
    int err = mapBiome(l, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    int styp = ((const int*) l->data)[0];
    int i, j;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int biomeID = out[i + w*j];
            switch (styp)
            {
            case Desert_Pyramid:
            case Desert_Well:
                if (biomeID == desert || isMesa(biomeID))
                    return 0;
                break;
            case Jungle_Pyramid:
                if (biomeID == jungle)
                    return 0;
                break;
            case Swamp_Hut:
                if (biomeID == swamp)
                    return 0;
                break;
            case Igloo:
                if (biomeID == snowy_tundra || biomeID == snowy_taiga)
                    return 0;
                break;
            case Treasure:
                if (isOceanic(biomeID))
                    return 0;
                break;
            case Ocean_Ruin:
            case Shipwreck:
            case Monument:
                if (isOceanic(biomeID))
                    return 0;
                break;
            case Mansion:
                if (biomeID == dark_forest)
                    return 0;
                break;
            default:
                return 0;
            }
        }
    }

    return 1; // required biomes not found: set err status to stop generator
}